

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O0

void __thiscall bgui::BaseWindow::~BaseWindow(BaseWindow *this)

{
  _XImage *p_Var1;
  Display *pDVar2;
  BaseWindowData *in_RDI;
  BaseWindow *in_stack_000000b0;
  
  in_RDI->parent = (BaseWindow *)&PTR__BaseWindow_00146bb0;
  sendClose(in_stack_000000b0);
  waitForClose((BaseWindow *)in_RDI);
  pthread_mutex_destroy((pthread_mutex_t *)&((BaseWindowData *)in_RDI->display)->mutex);
  if (((BaseWindowData *)in_RDI->display)->inotify_fd != 0) {
    close(((BaseWindowData *)in_RDI->display)->inotify_fd);
  }
  p_Var1 = ((BaseWindowData *)in_RDI->display)->image;
  (*(p_Var1->f).destroy_image)(p_Var1);
  XFreeFontInfo(0,((BaseWindowData *)in_RDI->display)->font,1);
  XFreeGC(((BaseWindowData *)in_RDI->display)->display,((BaseWindowData *)in_RDI->display)->gc);
  XDestroyWindow(((BaseWindowData *)in_RDI->display)->display,
                 ((BaseWindowData *)in_RDI->display)->window);
  XCloseDisplay(((BaseWindowData *)in_RDI->display)->display);
  pDVar2 = in_RDI->display;
  if (pDVar2 != (Display *)0x0) {
    BaseWindowData::~BaseWindowData(in_RDI);
    operator_delete(pDVar2);
  }
  return;
}

Assistant:

BaseWindow::~BaseWindow()
{
  sendClose();
  waitForClose();

  pthread_mutex_destroy(&(p->mutex));

#ifdef INCLUDE_INOTIFY

  if (p->inotify_fd != 0)
  {
    close(p->inotify_fd);
  }

#endif

  XDestroyImage(p->image);
  XFreeFontInfo(0, p->font, 1);
  XFreeGC(p->display, p->gc);
  XDestroyWindow(p->display, p->window);
  XCloseDisplay(p->display);

  delete p;
}